

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpresponseparser.h
# Opt level: O3

ParseResult __thiscall
httpparser::HttpResponseParser::consume
          (HttpResponseParser *this,Response *resp,char *begin,char *end)

{
  pointer *ppcVar1;
  size_t *psVar2;
  byte bVar3;
  iterator iVar4;
  char *__s1;
  State SVar5;
  size_t sVar6;
  ulong uVar7;
  pointer pHVar8;
  int iVar9;
  long lVar10;
  char cVar11;
  pointer pHVar12;
  pointer pHVar13;
  bool bVar14;
  HeaderItem local_b8;
  string *local_78;
  vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
  *local_70;
  string *local_68;
  vector<char,std::allocator<char>> *local_60;
  pointer local_58;
  Response *local_50;
  byte *local_48;
  HttpResponseParser *local_40;
  byte local_31 [8];
  char input;
  
  if (begin != end) {
    local_60 = (vector<char,std::allocator<char>> *)&resp->content;
    local_78 = &this->chunkSizeStr;
    local_70 = &resp->headers;
    local_68 = &resp->status;
    local_50 = resp;
    local_48 = (byte *)end;
    local_40 = this;
    do {
      bVar3 = *begin;
      if (ChunkData < this->state) {
        return ParsingError;
      }
      iVar9 = (int)(char)bVar3;
      cVar11 = (char)local_68;
      local_31[0] = bVar3;
      switch(this->state) {
      case ResponseStatusStart:
        if (bVar3 != 0x48) {
          return ParsingError;
        }
        this->state = ResponseHttpVersion_ht;
        break;
      case ResponseHttpVersion_ht:
        if (bVar3 != 0x54) {
          return ParsingError;
        }
        this->state = ResponseHttpVersion_htt;
        break;
      case ResponseHttpVersion_htt:
        if (bVar3 != 0x54) {
          return ParsingError;
        }
        this->state = ResponseHttpVersion_http;
        break;
      case ResponseHttpVersion_http:
        if (bVar3 != 0x50) {
          return ParsingError;
        }
        this->state = ResponseHttpVersion_slash;
        break;
      case ResponseHttpVersion_slash:
        if (bVar3 != 0x2f) {
          return ParsingError;
        }
        resp->versionMajor = 0;
        resp->versionMinor = 0;
        this->state = ResponseHttpVersion_majorStart;
        break;
      case ResponseHttpVersion_majorStart:
        if (9 < iVar9 - 0x30U) {
          return ParsingError;
        }
        resp->versionMajor = iVar9 - 0x30U;
        this->state = ResponseHttpVersion_major;
        break;
      case ResponseHttpVersion_major:
        if (bVar3 == 0x2e) {
          this->state = ResponseHttpVersion_minorStart;
        }
        else {
          if (9 < iVar9 - 0x30U) {
            return ParsingError;
          }
          resp->versionMajor = (iVar9 - 0x30U) + resp->versionMajor * 10;
        }
        break;
      case ResponseHttpVersion_minorStart:
        if (9 < iVar9 - 0x30U) {
          return ParsingError;
        }
        resp->versionMinor = iVar9 - 0x30U;
        this->state = ResponseHttpVersion_minor;
        break;
      case ResponseHttpVersion_minor:
        if (bVar3 == 0x20) {
          this->state = ResponseHttpVersion_statusCodeStart;
          resp->statusCode = 0;
        }
        else {
          if (9 < iVar9 - 0x30U) {
            return ParsingError;
          }
          resp->versionMinor = (iVar9 - 0x30U) + resp->versionMinor * 10;
        }
        break;
      case ResponseHttpVersion_statusCodeStart:
        if (9 < iVar9 - 0x30U) {
          return ParsingError;
        }
        resp->statusCode = iVar9 - 0x30U;
        this->state = ResponseHttpVersion_statusCode;
        break;
      case ResponseHttpVersion_statusCode:
        if (iVar9 - 0x30U < 10) {
          resp->statusCode = (iVar9 - 0x30U) + resp->statusCode * 10;
        }
        else {
          if (899 < resp->statusCode - 100) {
            return ParsingError;
          }
          if (bVar3 != 0x20) {
            return ParsingError;
          }
          this->state = ResponseHttpVersion_statusTextStart;
        }
        break;
      case ResponseHttpVersion_statusTextStart:
        if ((char)bVar3 < '\0') {
          return ParsingError;
        }
        std::__cxx11::string::push_back(cVar11);
        local_40->state = ResponseHttpVersion_statusText;
        end = (char *)local_48;
        resp = local_50;
        this = local_40;
        break;
      case ResponseHttpVersion_statusText:
        if (bVar3 == 0xd) {
          this->state = ResponseHttpVersion_newLine;
        }
        else {
          if ((char)bVar3 < '\0') {
            return ParsingError;
          }
LAB_001085e8:
          std::__cxx11::string::push_back(cVar11);
          end = (char *)local_48;
          resp = local_50;
          this = local_40;
        }
        break;
      default:
        if (bVar3 != 10) {
          return ParsingError;
        }
        this->state = HeaderLineStart;
        break;
      case HeaderLineStart:
        if (bVar3 == 0xd) {
          this->state = ExpectingNewline_3;
        }
        else if (((resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish) || ((bVar3 != 0x20 && (bVar3 != 9))))
        {
          if ((char)bVar3 < '\0') {
            return ParsingError;
          }
          if (bVar3 < 0x20) {
            return ParsingError;
          }
          if (bVar3 == 0x7f) {
            return ParsingError;
          }
          if ((bVar3 - 0x20 < 0x3e) &&
             ((0x38000001fc009305U >> ((ulong)(bVar3 - 0x20) & 0x3f) & 1) != 0)) {
            return ParsingError;
          }
          if (bVar3 == 0x7b) {
            return ParsingError;
          }
          if (bVar3 == 0x7d) {
            return ParsingError;
          }
          local_b8.name._M_dataplus._M_p = (pointer)&local_b8.name.field_2;
          local_b8.value.field_2._8_8_ = 0;
          local_b8.value._M_string_length = 0;
          local_b8.name.field_2._M_allocated_capacity = 0;
          local_b8.name.field_2._8_8_ = 0;
          local_b8.name._M_string_length = 0;
          local_b8.value._M_dataplus._M_p = (pointer)&local_b8.value.field_2;
          local_b8.value.field_2._M_allocated_capacity = 0;
          std::
          vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
          ::emplace_back<httpparser::Response::HeaderItem>(local_70,&local_b8);
          Response::HeaderItem::~HeaderItem(&local_b8);
          resp = local_50;
          std::__cxx11::string::reserve
                    ((ulong)((local_50->headers).
                             super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1));
          std::__cxx11::string::reserve
                    ((ulong)&(resp->headers).
                             super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].value);
          std::__cxx11::string::push_back
                    ((char)(resp->headers).
                           super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -0x40);
          local_40->state = HeaderName;
          end = (char *)local_48;
          this = local_40;
        }
        else {
          this->state = HeaderLws;
        }
        break;
      case HeaderLws:
        if ((bVar3 != 9) && (bVar3 != 0x20)) {
          if (bVar3 != 0xd) {
            if (bVar3 < 0x20) {
              return ParsingError;
            }
            if (bVar3 == 0x7f) {
              return ParsingError;
            }
            this->state = HeaderValue;
            goto LAB_001085e0;
          }
          this->state = ExpectingNewline_2;
        }
        break;
      case HeaderName:
        if (bVar3 != 0x3a) {
          if ((char)bVar3 < '\0') {
            return ParsingError;
          }
          if (bVar3 < 0x20) {
            return ParsingError;
          }
          if (bVar3 == 0x7f) {
            return ParsingError;
          }
          if ((bVar3 - 0x20 < 0x3e) &&
             ((0x38000001fc009305U >> ((ulong)(bVar3 - 0x20) & 0x3f) & 1) != 0)) {
            return ParsingError;
          }
          if (bVar3 == 0x7b) {
            return ParsingError;
          }
          if (bVar3 == 0x7d) {
            return ParsingError;
          }
          cVar11 = (char)(resp->headers).
                         super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -0x40;
          goto LAB_001085e8;
        }
        this->state = SpaceBeforeHeaderValue;
        break;
      case SpaceBeforeHeaderValue:
        if (bVar3 != 0x20) {
          return ParsingError;
        }
        this->state = HeaderValue;
        break;
      case HeaderValue:
        if (bVar3 != 0xd) {
          if (bVar3 < 0x20) {
            return ParsingError;
          }
          if (bVar3 == 0x7f) {
            return ParsingError;
          }
LAB_001085e0:
          cVar11 = (char)(resp->headers).
                         super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -0x20;
          goto LAB_001085e8;
        }
        pHVar13 = (resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __s1 = pHVar13[-1].name._M_dataplus._M_p;
        iVar9 = strcasecmp(__s1,"Content-Length");
        if (iVar9 == 0) {
          iVar9 = atoi(pHVar13[-1].value._M_dataplus._M_p);
          local_40->contentSize = (long)iVar9;
          std::vector<char,_std::allocator<char>_>::reserve
                    ((vector<char,_std::allocator<char>_> *)local_60,(long)iVar9);
        }
        else {
          iVar9 = strcasecmp(__s1,"Transfer-Encoding");
          if ((iVar9 == 0) &&
             (iVar9 = strcasecmp(pHVar13[-1].value._M_dataplus._M_p,"chunked"), iVar9 == 0)) {
            local_40->chunked = true;
          }
        }
        local_40->state = ExpectingNewline_2;
        end = (char *)local_48;
        resp = local_50;
        this = local_40;
        break;
      case ExpectingNewline_3:
        pHVar13 = (resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pHVar8 = (resp->headers).
                 super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar7 = (long)pHVar8 - (long)pHVar13;
        if (0 < (long)uVar7 >> 8) {
          pHVar12 = (pointer)((long)&(pHVar13->name)._M_dataplus._M_p + (uVar7 & 0xffffffffffffff00)
                             );
          lVar10 = ((long)uVar7 >> 8) + 1;
          pHVar13 = pHVar13 + 2;
          local_58 = pHVar8;
          do {
            iVar9 = strcasecmp(pHVar13[-2].name._M_dataplus._M_p,"Connection");
            if (iVar9 == 0) {
              pHVar8 = local_58;
              pHVar13 = pHVar13 + -2;
              goto LAB_0010869d;
            }
            iVar9 = strcasecmp(pHVar13[-1].name._M_dataplus._M_p,"Connection");
            if (iVar9 == 0) {
              pHVar8 = local_58;
              pHVar13 = pHVar13 + -1;
              goto LAB_0010869d;
            }
            iVar9 = strcasecmp((pHVar13->name)._M_dataplus._M_p,"Connection");
            pHVar8 = local_58;
            if (iVar9 == 0) goto LAB_0010869d;
            iVar9 = strcasecmp(pHVar13[1].name._M_dataplus._M_p,"Connection");
            pHVar8 = local_58;
            if (iVar9 == 0) {
              pHVar13 = pHVar13 + 1;
              goto LAB_0010869d;
            }
            lVar10 = lVar10 + -1;
            pHVar13 = pHVar13 + 4;
          } while (1 < lVar10);
          uVar7 = (long)local_58 - (long)pHVar12;
          resp = local_50;
          pHVar13 = pHVar12;
        }
        lVar10 = (long)uVar7 >> 6;
        if (lVar10 == 1) {
LAB_0010867a:
          iVar9 = strcasecmp((pHVar13->name)._M_dataplus._M_p,"Connection");
          if (iVar9 != 0) {
            pHVar13 = pHVar8;
          }
LAB_0010869d:
          resp = local_50;
          if (pHVar13 == pHVar8) goto LAB_001086c1;
          iVar9 = strcasecmp((pHVar13->value)._M_dataplus._M_p,"Keep-Alive");
          bVar14 = iVar9 == 0;
          resp = local_50;
LAB_001086d7:
          resp->keepAlive = bVar14;
        }
        else {
          if (lVar10 == 2) {
LAB_0010865d:
            iVar9 = strcasecmp((pHVar13->name)._M_dataplus._M_p,"Connection");
            if (iVar9 != 0) {
              pHVar13 = pHVar13 + 1;
              goto LAB_0010867a;
            }
            goto LAB_0010869d;
          }
          if (lVar10 == 3) {
            iVar9 = strcasecmp((pHVar13->name)._M_dataplus._M_p,"Connection");
            if (iVar9 != 0) {
              pHVar13 = pHVar13 + 1;
              goto LAB_0010865d;
            }
            goto LAB_0010869d;
          }
LAB_001086c1:
          bVar14 = true;
          if ((1 < resp->versionMajor) || ((resp->versionMajor == 1 && (resp->versionMinor == 1))))
          goto LAB_001086d7;
        }
        SVar5 = ChunkSize;
        if ((local_40->chunked == false) && (SVar5 = Post, local_40->contentSize == 0)) {
switchD_00107df7_caseD_1b:
          return (uint)(bVar3 != 10) * 2;
        }
        local_40->state = SVar5;
        end = (char *)local_48;
        this = local_40;
        break;
      case Post:
        this->contentSize = this->contentSize - 1;
        iVar4._M_current =
             (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_60,iVar4,(char *)local_31);
          end = (char *)local_48;
          resp = local_50;
          this = local_40;
        }
        else {
          *iVar4._M_current = bVar3;
          ppcVar1 = &(resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        if (this->contentSize == 0) {
          return ParsingCompleted;
        }
        break;
      case ChunkSize:
        iVar9 = isalnum(iVar9);
        if (iVar9 == 0) {
          resp = local_50;
          end = (char *)local_48;
          this = local_40;
          if (bVar3 == 0xd) {
            local_40->state = ChunkSizeNewLine;
          }
          else {
            if (bVar3 != 0x3b) {
              return ParsingError;
            }
            local_40->state = ChunkExtensionName;
          }
        }
        else {
          std::__cxx11::string::push_back((char)local_78);
          end = (char *)local_48;
          resp = local_50;
          this = local_40;
        }
        break;
      case ChunkExtensionName:
        iVar9 = isalnum(iVar9);
        end = (char *)local_48;
        resp = local_50;
        this = local_40;
        if (bVar3 != 0x20 && iVar9 == 0) {
          if (bVar3 == 0xd) goto LAB_001080a5;
          if (bVar3 != 0x3d) {
            return ParsingError;
          }
          local_40->state = ChunkExtensionValue;
        }
        break;
      case ChunkExtensionValue:
      case ChunkTrailerValue:
        iVar9 = isalnum(iVar9);
        end = (char *)local_48;
        resp = local_50;
        this = local_40;
        if (bVar3 != 0x20 && iVar9 == 0) {
          if (bVar3 != 0xd) {
            return ParsingError;
          }
LAB_001080a5:
          local_40->state = ChunkSizeNewLine;
          end = (char *)local_48;
          resp = local_50;
          this = local_40;
        }
        break;
      case ChunkSizeNewLine:
        if (bVar3 != 10) {
          return ParsingError;
        }
        sVar6 = strtol((local_40->chunkSizeStr)._M_dataplus._M_p,(char **)0x0,0x10);
        local_40->chunkSize = sVar6;
        (local_40->chunkSizeStr)._M_string_length = 0;
        *(local_40->chunkSizeStr)._M_dataplus._M_p = '\0';
        std::vector<char,_std::allocator<char>_>::reserve
                  ((vector<char,_std::allocator<char>_> *)local_60,
                   (size_type)
                   ((resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                   (local_40->chunkSize -
                   (long)(resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start)));
        resp = local_50;
        end = (char *)local_48;
        this = local_40;
        if (local_40->chunkSize == 0) {
          local_40->state = ChunkSizeNewLine_2;
        }
        else {
          local_40->state = ChunkData;
        }
        break;
      case ChunkSizeNewLine_2:
        if (bVar3 == 0xd) {
          this->state = ChunkSizeNewLine_3;
        }
        else {
          iVar9 = isalpha(iVar9);
          if (iVar9 == 0) {
            return ParsingError;
          }
          local_40->state = ChunkTrailerName;
          end = (char *)local_48;
          resp = local_50;
          this = local_40;
        }
        break;
      case ChunkSizeNewLine_3:
        goto switchD_00107df7_caseD_1b;
      case ChunkTrailerName:
        iVar9 = isalnum(iVar9);
        end = (char *)local_48;
        resp = local_50;
        this = local_40;
        if (iVar9 == 0) {
          if (bVar3 != 0x3a) {
            return ParsingError;
          }
          local_40->state = ChunkTrailerValue;
        }
        break;
      case ChunkDataNewLine_1:
        if (bVar3 != 0xd) {
          return ParsingError;
        }
        this->state = ChunkDataNewLine_2;
        break;
      case ChunkDataNewLine_2:
        if (bVar3 != 10) {
          return ParsingError;
        }
        this->state = ChunkSize;
        break;
      case ChunkData:
        iVar4._M_current =
             (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_60,iVar4,(char *)local_31);
          end = (char *)local_48;
          resp = local_50;
          this = local_40;
        }
        else {
          *iVar4._M_current = bVar3;
          ppcVar1 = &(resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        psVar2 = &this->chunkSize;
        *psVar2 = *psVar2 - 1;
        if (*psVar2 == 0) {
          this->state = ChunkDataNewLine_1;
        }
      }
      begin = (char *)((byte *)begin + 1);
    } while (begin != end);
  }
  return ParsingIncompleted;
}

Assistant:

ParseResult consume(Response &resp, const char *begin, const char *end)
    {
        while( begin != end )
        {
            char input = *begin++;

            switch (state)
            {
            case ResponseStatusStart:
                if( input != 'H' )
                {
                    return ParsingError;
                }
                else
                {
                    state = ResponseHttpVersion_ht;
                }
                break;
            case ResponseHttpVersion_ht:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_htt;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_htt:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_http;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_http:
                if( input == 'P' )
                {
                    state = ResponseHttpVersion_slash;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_slash:
                if( input == '/' )
                {
                    resp.versionMajor = 0;
                    resp.versionMinor = 0;
                    state = ResponseHttpVersion_majorStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_majorStart:
                if( isDigit(input) )
                {
                    resp.versionMajor = input - '0';
                    state = ResponseHttpVersion_major;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_major:
                if( input == '.' )
                {
                    state = ResponseHttpVersion_minorStart;
                }
                else if( isDigit(input) )
                {
                    resp.versionMajor = resp.versionMajor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minorStart:
                if( isDigit(input) )
                {
                    resp.versionMinor = input - '0';
                    state = ResponseHttpVersion_minor;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minor:
                if( input == ' ')
                {
                    state = ResponseHttpVersion_statusCodeStart;
                    resp.statusCode = 0;
                }
                else if( isDigit(input) )
                {
                    resp.versionMinor = resp.versionMinor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCodeStart:
                if( isDigit(input) )
                {
                    resp.statusCode = input - '0';
                    state = ResponseHttpVersion_statusCode;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCode:
                if( isDigit(input) )
                {
                    resp.statusCode = resp.statusCode * 10 + input - '0';
                }
                else
                {
                    if( resp.statusCode < 100 || resp.statusCode > 999 )
                    {
                        return ParsingError;
                    }
                    else if( input == ' ' )
                    {
                        state = ResponseHttpVersion_statusTextStart;
                    }
                    else
                    {
                        return ParsingError;
                    }
                }
                break;
            case ResponseHttpVersion_statusTextStart:
                if( isChar(input) )
                {
                    resp.status += input;
                    state = ResponseHttpVersion_statusText;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusText:
                if( input == '\r' )
                {
                    state = ResponseHttpVersion_newLine;
                }
                else if( isChar(input) )
                {
                    resp.status += input;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_newLine:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderLineStart:
                if( input == '\r' )
                {
                    state = ExpectingNewline_3;
                }
                else if( !resp.headers.empty() && (input == ' ' || input == '\t') )
                {
                    state = HeaderLws;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.push_back(Response::HeaderItem());
                    resp.headers.back().name.reserve(16);
                    resp.headers.back().value.reserve(16);
                    resp.headers.back().name.push_back(input);
                    state = HeaderName;
                }
                break;
            case HeaderLws:
                if( input == '\r' )
                {
                    state = ExpectingNewline_2;
                }
                else if( input == ' ' || input == '\t' )
                {
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    state = HeaderValue;
                    resp.headers.back().value.push_back(input);
                }
                break;
            case HeaderName:
                if( input == ':' )
                {
                    state = SpaceBeforeHeaderValue;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().name.push_back(input);
                }
                break;
            case SpaceBeforeHeaderValue:
                if( input == ' ' )
                {
                    state = HeaderValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderValue:
                if( input == '\r' )
                {
                    Response::HeaderItem &h = resp.headers.back();

                    if( strcasecmp(h.name.c_str(), "Content-Length") == 0 )
                    {
                        contentSize = atoi(h.value.c_str());
                        resp.content.reserve( contentSize );
                    }
                    else if( strcasecmp(h.name.c_str(), "Transfer-Encoding") == 0 )
                    {
                        if(strcasecmp(h.value.c_str(), "chunked") == 0)
                            chunked = true;
                    }
                    state = ExpectingNewline_2;
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().value.push_back(input);
                }
                break;
            case ExpectingNewline_2:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ExpectingNewline_3: {
                std::vector<Response::HeaderItem>::iterator it = std::find_if(resp.headers.begin(),
                                                                    resp.headers.end(),
                                                                    checkIfConnection);

                if( it != resp.headers.end() )
                {
                    if( strcasecmp(it->value.c_str(), "Keep-Alive") == 0 )
                    {
                        resp.keepAlive = true;
                    }
                    else  // == Close
                    {
                        resp.keepAlive = false;
                    }
                }
                else
                {
                    if( resp.versionMajor > 1 || (resp.versionMajor == 1 && resp.versionMinor == 1) )
                        resp.keepAlive = true;
                }

                if( chunked )
                {
                    state = ChunkSize;
                }
                else if( contentSize == 0 )
                {
                    if( input == '\n')
                        return ParsingCompleted;
                    else
                        return ParsingError;
                }

                else
                {
                    state = Post;
                }
                break;
            }
            case Post:
                --contentSize;
                resp.content.push_back(input);

                if( contentSize == 0 )
                {
                    return ParsingCompleted;
                }
                break;
            case ChunkSize:
                if( isalnum(input) )
                {
                    chunkSizeStr.push_back(input);
                }
                else if( input == ';' )
                {
                    state = ChunkExtensionName;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionName:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '=' )
                {
                    state = ChunkExtensionValue;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine:
                if( input == '\n' )
                {
                    chunkSize = strtol(chunkSizeStr.c_str(), NULL, 16);
                    chunkSizeStr.clear();
                    resp.content.reserve(resp.content.size() + chunkSize);

                    if( chunkSize == 0 )
                        state = ChunkSizeNewLine_2;
                    else
                        state = ChunkData;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_2:
                if( input == '\r' )
                {
                    state = ChunkSizeNewLine_3;
                }
                else if( isalpha(input) )
                {
                    state = ChunkTrailerName;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_3:
                if( input == '\n' )
                {
                    return ParsingCompleted;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerName:
                if( isalnum(input) )
                {
                    // skip
                }
                else if( input == ':' )
                {
                    state = ChunkTrailerValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkData:
                resp.content.push_back(input);

                if( --chunkSize == 0 )
                {
                    state = ChunkDataNewLine_1;
                }
                break;
            case ChunkDataNewLine_1:
                if( input == '\r' )
                {
                    state = ChunkDataNewLine_2;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkDataNewLine_2:
                if( input == '\n' )
                {
                    state = ChunkSize;
                }
                else
                {
                    return ParsingError;
                }
                break;
            default:
                return ParsingError;
            }
        }

        return ParsingIncompleted;
    }